

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O1

void * __thiscall cppjit::builder::builder::load_kernel(builder *this)

{
  pointer pcVar1;
  long *plVar2;
  void *pvVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  cppjit_exception *pcVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string library_file;
  stringstream s;
  string local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  
  if (this->kernel_library != (void *)0x0) {
    dlclose();
    this->kernel_library = (void *)0x0;
  }
  pcVar1 = (this->compile_dir)._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (this->compile_dir)._M_string_length);
  std::__cxx11::string::append((char *)&local_1f0);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f0,(ulong)(this->kernel_name)._M_dataplus._M_p);
  plVar8 = plVar2 + 2;
  if ((long *)*plVar2 == plVar8) {
    local_1a0 = *plVar8;
    lStack_198 = plVar2[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar8;
    local_1b0 = (long *)*plVar2;
  }
  local_1a8 = plVar2[1];
  *plVar2 = (long)plVar8;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  plVar8 = plVar2 + 2;
  if ((long *)*plVar2 == plVar8) {
    local_1c0 = *plVar8;
    lStack_1b8 = plVar2[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar8;
    local_1d0 = (long *)*plVar2;
  }
  local_1c8 = plVar2[1];
  *plVar2 = (long)plVar8;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  dlerror();
  pvVar3 = (void *)dlopen(local_1d0,1);
  this->kernel_library = pvVar3;
  lVar4 = dlerror();
  if (lVar4 == 0) {
    dlerror();
    pvVar3 = (void *)dlsym(this->kernel_library,(this->kernel_name)._M_dataplus._M_p);
    pcVar5 = (char *)dlerror();
    if (pcVar5 == (char *)0x0) {
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      return pvVar3;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"error: could not find kernel symbol, reason: ",0x2d);
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar5,sVar6);
    pcVar7 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    cppjit_exception::cppjit_exception(pcVar7,&local_1f0);
    __cxa_throw(pcVar7,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"error: could not open kernel shared library file, reason: ",0x3a
            );
  pcVar5 = (char *)dlerror();
  std::operator<<((ostream *)&local_1a0,pcVar5);
  pcVar7 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  cppjit_exception::cppjit_exception(pcVar7,&local_1f0);
  __cxa_throw(pcVar7,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *load_kernel() {
    if (kernel_library) {
      dlclose(kernel_library);
      kernel_library = nullptr;
    }

    std::string library_file(compile_dir + "lib" + kernel_name + ".so");

    dlerror();  // clear any prior error
    kernel_library = dlopen(library_file.c_str(), RTLD_LAZY);
    char *error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not open kernel shared library file, reason: ";
      s << dlerror();
      throw cppjit_exception(s.str());
    }

    dlerror();  // clear any prior error
    void *uncasted_function = dlsym(kernel_library, kernel_name.c_str());
    error = dlerror();

    if (error != nullptr) {
      std::stringstream s;
      s << "error: could not find kernel symbol, reason: ";
      s << error;
      throw cppjit_exception(s.str());
    }
    return uncasted_function;
  }